

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaRetime.c
# Opt level: O2

Gia_Man_t * Gia_ManRetimeForwardOne(Gia_Man_t *p,int *pnRegFixed,int *pnRegMoves)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Gia_Obj_t *pGVar4;
  Vec_Int_t *p_00;
  ulong uVar5;
  Vec_Ptr_t *vCut;
  void **ppvVar6;
  Gia_Man_t *pGVar7;
  int iVar8;
  Vec_Int_t *local_38;
  
  p_00 = (Vec_Int_t *)0x0;
  if (p->vFlopClasses == (Vec_Int_t *)0x0) {
    local_38 = (Vec_Int_t *)0x0;
  }
  else {
    local_38 = Vec_IntAlloc(p->nObjs);
    for (; (int)p_00 < p->nObjs; p_00 = (Vec_Int_t *)(ulong)((int)p_00 + 1)) {
      Vec_IntPush(local_38,-1);
    }
    for (iVar8 = 0; iVar1 = p->nRegs, iVar8 < iVar1; iVar8 = iVar8 + 1) {
      pGVar4 = Gia_ManCi(p,(p->vCis->nSize - iVar1) + iVar8);
      if (pGVar4 == (Gia_Obj_t *)0x0) {
        iVar1 = p->nRegs;
        break;
      }
      iVar1 = Gia_ObjId(p,pGVar4);
      iVar2 = Vec_IntEntry(p->vFlopClasses,iVar8);
      Vec_IntWriteEntry(local_38,iVar1,iVar2);
    }
    p_00 = Vec_IntAlloc(iVar1);
  }
  Gia_ManIncrementTravId(p);
  Gia_ManMarkAutonomous(p);
  Gia_ManIncrementTravId(p);
  *pnRegFixed = 0;
  iVar8 = 0;
  while( true ) {
    if (p->nRegs <= iVar8) break;
    pGVar4 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar8);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    iVar1 = Gia_ObjIsTravIdPrevious(p,pGVar4);
    if (iVar1 == 0) {
      *pnRegFixed = *pnRegFixed + 1;
    }
    else {
      Gia_ObjSetTravIdCurrent(p,pGVar4);
    }
    iVar8 = iVar8 + 1;
  }
  *pnRegMoves = 0;
  for (iVar8 = 0; iVar8 < p->nObjs; iVar8 = iVar8 + 1) {
    pGVar4 = Gia_ManObj(p,iVar8);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    uVar5 = *(ulong *)pGVar4 & 0x1fffffff;
    if (uVar5 != 0x1fffffff && -1 < (int)*(ulong *)pGVar4) {
      iVar1 = Gia_ObjIsTravIdCurrent(p,pGVar4 + -uVar5);
      if (iVar1 != 0) {
        iVar1 = Gia_ObjIsTravIdCurrent
                          (p,pGVar4 + -(ulong)(*(uint *)&pGVar4->field_0x4 & 0x1fffffff));
        if (iVar1 != 0) {
          if (local_38 != (Vec_Int_t *)0x0) {
            iVar1 = Vec_IntEntry(local_38,iVar8 - (*(uint *)pGVar4 & 0x1fffffff));
            iVar2 = Vec_IntEntry(local_38,iVar8 - (*(uint *)&pGVar4->field_0x4 & 0x1fffffff));
            if (iVar1 != iVar2) goto LAB_0062518f;
            iVar1 = Gia_ObjId(p,pGVar4);
            iVar2 = Vec_IntEntry(local_38,iVar8 - (*(uint *)pGVar4 & 0x1fffffff));
            Vec_IntWriteEntry(local_38,iVar1,iVar2);
          }
          Gia_ObjSetTravIdCurrent(p,pGVar4);
          *pnRegMoves = *pnRegMoves + 1;
        }
      }
    }
LAB_0062518f:
  }
  for (iVar8 = 0; iVar8 < p->nRegs; iVar8 = iVar8 + 1) {
    pGVar4 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar8);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    Gia_ObjSetTravIdCurrent(p,pGVar4);
  }
  vCut = (Vec_Ptr_t *)malloc(0x10);
  vCut->nCap = 1000;
  vCut->nSize = 0;
  ppvVar6 = (void **)malloc(8000);
  vCut->pArray = ppvVar6;
  Gia_ManIncrementTravId(p);
  for (iVar8 = 0; iVar8 < p->nObjs; iVar8 = iVar8 + 1) {
    pGVar4 = Gia_ManObj(p,iVar8);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    iVar1 = Gia_ObjIsTravIdPrevious(p,pGVar4);
    if (iVar1 == 0) {
      if ((*(ulong *)pGVar4 & 0x1fffffff) != 0x1fffffff) {
        iVar1 = Gia_ObjIsTravIdPrevious(p,pGVar4 + -(*(ulong *)pGVar4 & 0x1fffffff));
        if (iVar1 != 0) {
          if (p_00 != (Vec_Int_t *)0x0) {
            iVar1 = Vec_IntEntry(local_38,iVar8 - (*(uint *)pGVar4 & 0x1fffffff));
            Vec_IntPush(p_00,iVar1);
          }
          Vec_PtrPush(vCut,pGVar4 + -(*(ulong *)pGVar4 & 0x1fffffff));
          Gia_ObjSetTravIdCurrent(p,pGVar4 + -(*(ulong *)pGVar4 & 0x1fffffff));
        }
      }
      uVar3 = (uint)*(undefined8 *)pGVar4;
      if ((~uVar3 & 0x1fffffff) != 0 && -1 < (int)uVar3) {
        iVar1 = Gia_ObjIsTravIdPrevious
                          (p,pGVar4 + -(ulong)((uint)((ulong)*(undefined8 *)pGVar4 >> 0x20) &
                                              0x1fffffff));
        if (iVar1 != 0) {
          if (p_00 != (Vec_Int_t *)0x0) {
            iVar1 = Vec_IntEntry(local_38,iVar8 - (*(uint *)&pGVar4->field_0x4 & 0x1fffffff));
            Vec_IntPush(p_00,iVar1);
          }
          Vec_PtrPush(vCut,pGVar4 + -((ulong)*(uint *)&pGVar4->field_0x4 & 0x1fffffff));
          Gia_ObjSetTravIdCurrent(p,pGVar4 + -((ulong)*(uint *)&pGVar4->field_0x4 & 0x1fffffff));
        }
      }
    }
  }
  if ((p_00 != (Vec_Int_t *)0x0) && (p_00->nSize != vCut->nSize)) {
    __assert_fail("vFlopClasses == NULL || Vec_IntSize(vFlopClasses) == Vec_PtrSize(vCut)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaRetime.c"
                  ,0xf6,"Gia_Man_t *Gia_ManRetimeForwardOne(Gia_Man_t *, int *, int *)");
  }
  pGVar7 = Gia_ManRetimeDupForward(p,vCut);
  free(vCut->pArray);
  free(vCut);
  if (local_38 != (Vec_Int_t *)0x0) {
    free(local_38->pArray);
    free(local_38);
  }
  pGVar7->vFlopClasses = p_00;
  return pGVar7;
}

Assistant:

Gia_Man_t * Gia_ManRetimeForwardOne( Gia_Man_t * p, int * pnRegFixed, int * pnRegMoves )
{
    Vec_Int_t * vFlopClasses = NULL;
    Vec_Int_t * vObjClasses = NULL;
    Gia_Man_t * pNew;
    Vec_Ptr_t * vCut;
    Gia_Obj_t * pObj;
    int i;
    if ( p->vFlopClasses )
    {
//        printf( "Performing retiming with register classes.\n" );
        vObjClasses = Vec_IntAlloc( Gia_ManObjNum(p) );
        for ( i = 0; i < Gia_ManObjNum(p); i++ )
            Vec_IntPush( vObjClasses, -1 );
        Gia_ManForEachRo( p, pObj, i )
            Vec_IntWriteEntry( vObjClasses, Gia_ObjId(p, pObj), Vec_IntEntry(p->vFlopClasses, i) );
        vFlopClasses = Vec_IntAlloc( Gia_ManRegNum(p) );
    }
    // mark the retimable nodes
    Gia_ManIncrementTravId( p );
    Gia_ManMarkAutonomous( p );
    // mark the retimable registers with the fresh trav ID
    Gia_ManIncrementTravId( p );
    *pnRegFixed = 0;
    Gia_ManForEachRo( p, pObj, i )
        if ( Gia_ObjIsTravIdPrevious(p, pObj) )
            Gia_ObjSetTravIdCurrent(p, pObj);
        else
            (*pnRegFixed)++;
    // mark all the nodes that can be retimed forward
    *pnRegMoves = 0;
    Gia_ManForEachAnd( p, pObj, i )
        if ( Gia_ObjIsTravIdCurrent(p, Gia_ObjFanin0(pObj)) && Gia_ObjIsTravIdCurrent(p, Gia_ObjFanin1(pObj)) )
        {
            if ( vObjClasses && Vec_IntEntry(vObjClasses, Gia_ObjFaninId0(pObj, i)) != Vec_IntEntry(vObjClasses, Gia_ObjFaninId1(pObj, i)) )
                continue;
            if ( vObjClasses )
                Vec_IntWriteEntry( vObjClasses, Gia_ObjId(p, pObj), Vec_IntEntry(vObjClasses, Gia_ObjFaninId0(pObj, i)) );
            Gia_ObjSetTravIdCurrent(p, pObj);
            (*pnRegMoves)++;
        }
    // mark the remaining registers
    Gia_ManForEachRo( p, pObj, i )
        Gia_ObjSetTravIdCurrent(p, pObj);
    // find the cut (all such marked objects that fanout into unmarked nodes)
    vCut = Vec_PtrAlloc( 1000 );
    Gia_ManIncrementTravId( p );
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( Gia_ObjIsTravIdPrevious(p, pObj) )
            continue;
        if ( (Gia_ObjIsCo(pObj) || Gia_ObjIsAnd(pObj)) && Gia_ObjIsTravIdPrevious(p, Gia_ObjFanin0(pObj)) )
        {
            if ( vFlopClasses )
                Vec_IntPush( vFlopClasses, Vec_IntEntry(vObjClasses, Gia_ObjFaninId0(pObj, i)) );
            Vec_PtrPush( vCut, Gia_ObjFanin0(pObj) );
            Gia_ObjSetTravIdCurrent( p, Gia_ObjFanin0(pObj) );
        }
        if ( Gia_ObjIsAnd(pObj) && Gia_ObjIsTravIdPrevious(p, Gia_ObjFanin1(pObj)) )
        {
            if ( vFlopClasses )
                Vec_IntPush( vFlopClasses, Vec_IntEntry(vObjClasses, Gia_ObjFaninId1(pObj, i)) );
            Vec_PtrPush( vCut, Gia_ObjFanin1(pObj) );
            Gia_ObjSetTravIdCurrent( p, Gia_ObjFanin1(pObj) );
        }
    }
    assert( vFlopClasses == NULL || Vec_IntSize(vFlopClasses) == Vec_PtrSize(vCut) );
    // finally derive the new manager
    pNew = Gia_ManRetimeDupForward( p, vCut );
    Vec_PtrFree( vCut );
    if ( vObjClasses )
    Vec_IntFree( vObjClasses );
    pNew->vFlopClasses = vFlopClasses;
    return pNew;
}